

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

ArrayPtr<const_kj::(anonymous_namespace)::HttpResponseTestCase>
kj::anon_unknown_0::responseTestCases(void)

{
  int iVar1;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpResponseTestCase> AVar2;
  StringPtr statusText;
  StringPtr statusText_00;
  StringPtr statusText_01;
  StringPtr statusText_02;
  StringPtr statusText_03;
  StringPtr statusText_04;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init;
  initializer_list<kj::StringPtr> init_00;
  StringPtr raw;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_01;
  StringPtr raw_00;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_02;
  StringPtr raw_01;
  StringPtr raw_02;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_03;
  initializer_list<kj::StringPtr> init_04;
  StringPtr raw_03;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_05;
  initializer_list<kj::StringPtr> init_06;
  StringPtr raw_04;
  Maybe<unsigned_long> local_2c0;
  Maybe<unsigned_long> local_2b0;
  Maybe<unsigned_long> local_2a0;
  Maybe<unsigned_long> local_290;
  Maybe<unsigned_long> local_280;
  Array<kj::StringPtr> local_270;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_258;
  Array<kj::StringPtr> local_240;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_228;
  Array<kj::StringPtr> local_210;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1f8;
  Array<kj::StringPtr> local_1e0;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1c8;
  Array<kj::StringPtr> local_1b0;
  Maybe<unsigned_long> local_198;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_188;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_170;
  StringPtr local_158;
  Array<kj::StringPtr> local_148;
  StringPtr local_130;
  char *local_120;
  undefined8 local_118;
  HeaderTestCase local_110;
  StringPtr local_f0;
  char *local_e0;
  undefined8 local_d8;
  HeaderTestCase local_d0;
  HeaderTestCase local_b0;
  HeaderTestCase local_90;
  HeaderTestCase local_70;
  undefined8 local_50;
  undefined4 local_48;
  char *local_40;
  undefined8 local_38;
  
  if ((anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES);
    if (iVar1 != 0) {
      local_90.id.id = 0xe;
      local_90.id.table = (HttpHeaderTable *)0x0;
      local_90.value.content.ptr = "text/plain";
      local_90.value.content.size_ = 0xb;
      init._M_len = 1;
      init._M_array = &local_90;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_188,init);
      local_198.ptr.isSet = false;
      local_158.content.ptr = "baz qux";
      local_158.content.size_ = 8;
      init_00._M_len = 1;
      init_00._M_array = &local_158;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_1b0,init_00);
      statusText.content.size_ = 3;
      statusText.content.ptr = "OK";
      raw.content.size_ = 0x48;
      raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Type: text/plain\r\nConnection: close\r\n\r\nbaz qux";
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES,raw,200,statusText,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_188,
                 &local_198,(InitializeableArray<kj::StringPtr> *)&local_1b0,GET,CLIENT_ONLY);
      local_b0.id.id = 0xe;
      local_b0.id.table = (HttpHeaderTable *)0x0;
      local_b0.value.content.ptr = "text/plain";
      local_b0.value.content.size_ = 0xb;
      init_01._M_len = 1;
      init_01._M_array = &local_b0;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1c8,
                 init_01);
      local_290.ptr.isSet = true;
      local_290.ptr.field_1.value = 0x7b;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_1e0,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      statusText_00.content.size_ = 3;
      statusText_00.content.ptr = "OK";
      raw_00.content.size_ = 0x43;
      raw_00.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 123\r\nContent-Type: text/plain\r\n\r\n";
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 1,raw_00,200,statusText_00,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1c8,
                 &local_290,(InitializeableArray<kj::StringPtr> *)&local_1e0,HEAD,BOTH);
      local_70.id.id = 0xe;
      local_70.id.table = (HttpHeaderTable *)0x0;
      local_70.value.content.ptr = "text/plain";
      local_70.value.content.size_ = 0xb;
      local_50 = 0;
      local_48 = 5;
      local_40 = "foobar";
      local_38 = 7;
      init_02._M_len = 2;
      init_02._M_array = &local_70;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1f8,
                 init_02);
      local_2a0.ptr.isSet = true;
      local_2a0.ptr.field_1.value = 0x7b;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_210,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      statusText_01.content.size_ = 3;
      statusText_01.content.ptr = "OK";
      raw_01.content.size_ = 0x46;
      raw_01.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: foobar\r\nContent-Type: text/plain\r\n\r\n";
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 2,raw_01,200,statusText_01,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1f8,
                 &local_2a0,(InitializeableArray<kj::StringPtr> *)&local_210,HEAD,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_228,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_2b0.ptr.isSet = true;
      local_2b0.ptr.field_1.value = 0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_240,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      statusText_02.content.size_ = 3;
      statusText_02.content.ptr = "OK";
      raw_02.content.size_ = 0x14;
      raw_02.content.ptr = "HTTP/1.1 200 OK\r\n\r\n";
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 3,raw_02,200,statusText_02,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_228,
                 &local_2b0,(InitializeableArray<kj::StringPtr> *)&local_240,HEAD,BOTH);
      local_d0.id.id = 0xe;
      local_d0.id.table = (HttpHeaderTable *)0x0;
      local_d0.value.content.ptr = "text/plain";
      local_d0.value.content.size_ = 0xb;
      init_03._M_len = 1;
      init_03._M_array = &local_d0;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_258,
                 init_03);
      local_2c0.ptr.isSet = true;
      local_2c0.ptr.field_1.value = 8;
      local_f0.content.ptr = "qux";
      local_f0.content.size_ = 4;
      local_e0 = "corge";
      local_d8 = 6;
      init_04._M_len = 2;
      init_04._M_array = &local_f0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_270,init_04);
      statusText_03.content.size_ = 3;
      statusText_03.content.ptr = "OK";
      raw_03.content.size_ = 0x49;
      raw_03.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 8\r\nContent-Type: text/plain\r\n\r\nquxcorge";
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 4,raw_03,200,statusText_03,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_258,
                 &local_2c0,(InitializeableArray<kj::StringPtr> *)&local_270,GET,BOTH);
      local_110.id.id = 0xe;
      local_110.id.table = (HttpHeaderTable *)0x0;
      local_110.value.content.ptr = "text/plain";
      local_110.value.content.size_ = 0xb;
      init_05._M_len = 1;
      init_05._M_array = &local_110;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_170,
                 init_05);
      local_280.ptr.isSet = false;
      local_130.content.ptr = "qux";
      local_130.content.size_ = 4;
      local_120 = "corge";
      local_118 = 6;
      init_06._M_len = 2;
      init_06._M_array = &local_130;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_148,init_06);
      statusText_04.content.size_ = 3;
      statusText_04.content.ptr = "OK";
      raw_04.content.size_ = 0x61;
      raw_04.content.ptr =
           "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\nContent-Type: text/plain\r\n\r\n3\r\nqux\r\n5\r\ncorge\r\n0\r\n\r\n"
      ;
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 5,raw_04,200,statusText_04,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_170,
                 &local_280,(InitializeableArray<kj::StringPtr> *)&local_148,GET,BOTH);
      Array<kj::StringPtr>::~Array(&local_148);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_170);
      Array<kj::StringPtr>::~Array(&local_270);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_258);
      Array<kj::StringPtr>::~Array(&local_240);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_228);
      Array<kj::StringPtr>::~Array(&local_210);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1f8);
      Array<kj::StringPtr>::~Array(&local_1e0);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1c8);
      Array<kj::StringPtr>::~Array(&local_1b0);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_188);
      __cxa_atexit(__cxx_global_array_dtor_460,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES);
    }
  }
  AVar2.size_ = 6;
  AVar2.ptr = responseTestCases::RESPONSE_TEST_CASES;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const HttpResponseTestCase> responseTestCases() {
  static const HttpResponseTestCase RESPONSE_TEST_CASES[] {
    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Type: text/plain\r\n"
      "Connection: close\r\n"
      "\r\n"
      "baz qux",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      nullptr, {"baz qux"},

      HttpMethod::GET,
      CLIENT_ONLY,   // Server never sends connection: close
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: 123\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      123, {},

      HttpMethod::HEAD,
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: foobar\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"},
       {HttpHeaderId::CONTENT_LENGTH, "foobar"}},
      123, {},

      HttpMethod::HEAD,
    },

    // Zero-length expected size response to HEAD request has no Content-Length header.
    {
      "HTTP/1.1 200 OK\r\n"
      "\r\n",

      200, "OK",
      {},
      uint64_t(0), {},

      HttpMethod::HEAD,
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: 8\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n"
      "quxcorge",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      8, { "qux", "corge" }
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Transfer-Encoding: chunked\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n"
      "3\r\n"
      "qux\r\n"
      "5\r\n"
      "corge\r\n"
      "0\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      nullptr, { "qux", "corge" }
    },
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents RESPONSE_TEST_CASES from implicitly
  //   casting to our return type.
  return kj::arrayPtr(RESPONSE_TEST_CASES, kj::size(RESPONSE_TEST_CASES));
}